

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O0

SFInstrument * __thiscall sf2cute::SFInstrument::operator=(SFInstrument *this,SFInstrument *origin)

{
  SFInstrument *origin_local;
  SFInstrument *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)origin);
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::operator=(&this->zones_,&origin->zones_);
  std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>::
  operator=(&this->global_zone_,&origin->global_zone_);
  this->parent_file_ = (SoundFont *)0x0;
  SetBackwardReferences(this);
  return this;
}

Assistant:

SFInstrument & SFInstrument::operator=(SFInstrument && origin) noexcept {
  // Copy fields.
  name_ = std::move(origin.name_);
  zones_ = std::move(origin.zones_);
  global_zone_ = std::move(origin.global_zone_);
  parent_file_ = nullptr;

  // Repair references.
  SetBackwardReferences();

  return *this;
}